

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  int iVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID id;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  pIVar3 = GImGui;
  iVar1 = (GImGui->CurrentPopupStack).Size;
  if ((iVar1 < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->OpenPopupStack).Data[iVar1].PopupId == id)) {
    if ((pIVar4->NextWindowData).PosCond == 0) {
      IVar2.y = (pIVar4->IO).DisplaySize.y * 0.5;
      IVar2.x = (pIVar4->IO).DisplaySize.x * 0.5;
      (GImGui->NextWindowData).PosVal = IVar2;
      (pIVar3->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar3->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar3->NextWindowData).PosCond = 8;
    }
    bVar5 = Begin(name,p_open,flags | 0xc000120);
    if (bVar5) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      if (bVar5) {
        ClosePopup(id);
      }
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar4->NextWindowData).CollapsedCond = 0;
    (pIVar4->NextWindowData).SizeConstraintCond = 0;
    (pIVar4->NextWindowData).FocusCond = 0;
    (pIVar4->NextWindowData).BgAlphaCond = 0;
    (pIVar4->NextWindowData).PosCond = 0;
    (pIVar4->NextWindowData).SizeCond = 0;
    (pIVar4->NextWindowData).ContentSizeCond = 0;
    (pIVar4->NextWindowData).CollapsedCond = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if (g.NextWindowData.PosCond == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    bool is_open = Begin(name, p_open, flags | ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopup(id);
        return false;
    }

    return is_open;
}